

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::scrollContentsBy(QGraphicsView *this,int dx,int dy)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  uint uVar4;
  QGraphicsViewPrivate *pQVar5;
  int *piVar6;
  ulong uVar7;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  double dVar8;
  qreal inverseDpr;
  qreal dpr;
  QGraphicsViewPrivate *d;
  QRegion exposedScaled;
  QRegion exposed;
  QRegion rubberBandRegion;
  CacheModeFlag in_stack_ffffffffffffff1c;
  QGraphicsViewPrivate *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QGraphicsViewPrivate *this_00;
  int local_9c;
  QRegion in_stack_ffffffffffffff70;
  QWidget *in_stack_ffffffffffffff78;
  QRegion local_78;
  QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4> local_6c;
  QRegion local_68;
  QRegion local_60 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsView *)0xa40338);
  *(uint *)&pQVar5->field_0x300 = *(uint *)&pQVar5->field_0x300 & 0xffffffdf | 0x20;
  if ((*(uint *)&pQVar5->field_0x300 >> 8 & 1) == 0) {
    bVar1 = QWidget::isRightToLeft((QWidget *)0xa40379);
    local_9c = in_ESI;
    if (bVar1) {
      local_9c = -in_ESI;
    }
    if (pQVar5->viewportUpdateMode != NoViewportUpdate) {
      if (pQVar5->viewportUpdateMode == FullViewportUpdate) {
        QGraphicsViewPrivate::updateAll(in_stack_ffffffffffffff20);
      }
      else if ((*(uint *)&pQVar5->field_0x300 >> 6 & 1) == 0) {
        QGraphicsViewPrivate::updateAll(in_stack_ffffffffffffff20);
      }
      else {
        bVar1 = QRect::isEmpty((QRect *)in_stack_ffffffffffffff20);
        if (!bVar1) {
          local_60[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          this_00 = pQVar5;
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff20);
          QGraphicsViewPrivate::rubberBandRegion
                    (this_00,(QWidget *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          QRegion::translated((int)&local_68,(int)local_60);
          QRegion::operator+=(local_60,(QRegion *)&local_68);
          QRegion::~QRegion(&local_68);
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff20);
          QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (QRegion *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          QRegion::~QRegion(local_60);
        }
        iVar3 = local_9c;
        piVar6 = QPoint::rx((QPoint *)0xa404a7);
        *piVar6 = iVar3 + *piVar6;
        iVar3 = in_EDX;
        piVar6 = QPoint::ry((QPoint *)0xa404c8);
        *piVar6 = iVar3 + *piVar6;
        QRegion::translate((int)pQVar5 + 0x528,local_9c);
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff20);
        QWidget::scroll(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70.d >> 0x20),
                        (int)in_stack_ffffffffffffff70.d);
      }
    }
    QGraphicsViewPrivate::updateLastCenterPoint
              ((QGraphicsViewPrivate *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
              );
    local_6c.super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i =
         (QFlagsStorage<QGraphicsView::CacheModeFlag>)
         QFlags<QGraphicsView::CacheModeFlag>::operator&
                   ((QFlags<QGraphicsView::CacheModeFlag> *)in_stack_ffffffffffffff20,
                    in_stack_ffffffffffffff1c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
    if (IVar2 != 0) {
      dVar8 = (double)QPixmap::devicePixelRatio();
      local_78.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_78);
      uVar7 = QPixmap::isNull();
      if ((uVar7 & 1) == 0) {
        in_stack_ffffffffffffff20 = (QGraphicsViewPrivate *)&pQVar5->backgroundPixmap;
        iVar3 = (int)((double)local_9c * dVar8);
        uVar4 = (uint)((double)in_EDX * dVar8);
        QPixmap::rect();
        QPixmap::scroll((int)in_stack_ffffffffffffff20,iVar3,(QRect *)(ulong)uVar4,
                        (QRegion *)&stack0xffffffffffffff78);
      }
      QRegion::translate((int)pQVar5 + 0x508,local_9c);
      QTransform::fromScale(1.0 / dVar8,1.0 / dVar8);
      QTransform::map((QRegion *)&stack0xffffffffffffff70);
      QRegion::operator+=(&pQVar5->backgroundPixmapExposed,(QRegion *)&stack0xffffffffffffff70);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffff70);
      QRegion::~QRegion(&local_78);
    }
    if ((*(uint *)&pQVar5->field_0x300 & 1) != 0) {
      QGraphicsViewPrivate::replayLastMouseEvent(in_stack_ffffffffffffff20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::scrollContentsBy(int dx, int dy)
{
    Q_D(QGraphicsView);
    d->dirtyScroll = true;
    if (d->transforming)
        return;
    if (isRightToLeft())
        dx = -dx;

    if (d->viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (d->viewportUpdateMode != QGraphicsView::FullViewportUpdate) {
            if (d->accelerateScrolling) {
#if QT_CONFIG(rubberband)
                // Update new and old rubberband regions
                if (!d->rubberBandRect.isEmpty()) {
                    QRegion rubberBandRegion(d->rubberBandRegion(viewport(), d->rubberBandRect));
                    rubberBandRegion += rubberBandRegion.translated(-dx, -dy);
                    viewport()->update(rubberBandRegion);
                }
#endif
                d->dirtyScrollOffset.rx() += dx;
                d->dirtyScrollOffset.ry() += dy;
                d->dirtyRegion.translate(dx, dy);
                viewport()->scroll(dx, dy);
            } else {
                d->updateAll();
            }
        } else {
            d->updateAll();
        }
    }

    d->updateLastCenterPoint();

    if (d->cacheMode & CacheBackground) {
        // Below, QPixmap::scroll() works in device pixels, while the delta values
        // and backgroundPixmapExposed are in device independent pixels.
        const qreal dpr = d->backgroundPixmap.devicePixelRatio();
        const qreal inverseDpr = qreal(1) / dpr;

        // Scroll the background pixmap
        QRegion exposed;
        if (!d->backgroundPixmap.isNull())
            d->backgroundPixmap.scroll(dx * dpr, dy * dpr, d->backgroundPixmap.rect(), &exposed);

        // Invalidate the background pixmap
        d->backgroundPixmapExposed.translate(dx, dy);
        const QRegion exposedScaled = QTransform::fromScale(inverseDpr, inverseDpr).map(exposed);
        d->backgroundPixmapExposed += exposedScaled;
    }

    // Always replay on scroll.
    if (d->sceneInteractionAllowed)
        d->replayLastMouseEvent();
}